

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cc
# Opt level: O0

void __thiscall wabt::Features::AddOptions(Features *this,OptionParser *parser)

{
  OptionParser *pOVar1;
  anon_class_8_1_8991fb9c local_190;
  NullCallback local_188;
  anon_class_8_1_8991fb9c local_168;
  NullCallback local_160;
  anon_class_8_1_8991fb9c local_140;
  NullCallback local_138;
  anon_class_8_1_8991fb9c local_118;
  NullCallback local_110;
  anon_class_8_1_8991fb9c local_f0;
  NullCallback local_e8;
  anon_class_8_1_8991fb9c local_c8;
  NullCallback local_c0;
  anon_class_8_1_8991fb9c local_a0;
  NullCallback local_98;
  anon_class_8_1_8991fb9c local_78;
  NullCallback local_70;
  anon_class_8_1_8991fb9c local_40;
  NullCallback local_38;
  OptionParser *local_18;
  OptionParser *parser_local;
  Features *this_local;
  
  local_40.this = this;
  local_18 = parser;
  parser_local = (OptionParser *)this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__1,void>
            ((function<void()> *)&local_38,&local_40);
  OptionParser::AddOption
            (parser,"enable-exceptions","Enable Experimental exception handling",&local_38);
  std::function<void_()>::~function(&local_38);
  pOVar1 = local_18;
  local_78.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__2,void>
            ((function<void()> *)&local_70,&local_78);
  OptionParser::AddOption
            (pOVar1,"disable-mutable-globals","Disable Import/export mutable globals",&local_70);
  std::function<void_()>::~function(&local_70);
  pOVar1 = local_18;
  local_a0.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__5,void>
            ((function<void()> *)&local_98,&local_a0);
  OptionParser::AddOption
            (pOVar1,"enable-saturating-float-to-int","Enable Saturating float-to-int operators",
             &local_98);
  std::function<void_()>::~function(&local_98);
  pOVar1 = local_18;
  local_c8.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__7,void>
            ((function<void()> *)&local_c0,&local_c8);
  OptionParser::AddOption
            (pOVar1,"enable-sign-extension","Enable Sign-extension operators",&local_c0);
  std::function<void_()>::~function(&local_c0);
  pOVar1 = local_18;
  local_f0.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__9,void>
            ((function<void()> *)&local_e8,&local_f0);
  OptionParser::AddOption(pOVar1,"enable-simd","Enable SIMD support",&local_e8);
  std::function<void_()>::~function(&local_e8);
  pOVar1 = local_18;
  local_118.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__11,void>
            ((function<void()> *)&local_110,&local_118);
  OptionParser::AddOption(pOVar1,"enable-threads","Enable Threading support",&local_110);
  std::function<void_()>::~function(&local_110);
  pOVar1 = local_18;
  local_140.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__13,void>
            ((function<void()> *)&local_138,&local_140);
  OptionParser::AddOption(pOVar1,"enable-multi-value","Enable Multi-value",&local_138);
  std::function<void_()>::~function(&local_138);
  pOVar1 = local_18;
  local_168.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__15,void>
            ((function<void()> *)&local_160,&local_168);
  OptionParser::AddOption(pOVar1,"enable-tail-call","Enable Tail-call support",&local_160);
  std::function<void_()>::~function(&local_160);
  pOVar1 = local_18;
  local_190.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__17,void>
            ((function<void()> *)&local_188,&local_190);
  OptionParser::AddOption(pOVar1,"enable-bulk-memory","Enable Bulk-memory operations",&local_188);
  std::function<void_()>::~function(&local_188);
  return;
}

Assistant:

void Features::AddOptions(OptionParser* parser) {
#define WABT_FEATURE(variable, flag, default_, help)       \
  if (default_ == true) {                                  \
    parser->AddOption("disable-" flag, "Disable " help,    \
                      [this]() { disable_##variable(); }); \
  } else {                                                 \
    parser->AddOption("enable-" flag, "Enable " help,      \
                      [this]() { enable_##variable(); });  \
  }

#include "src/feature.def"
#undef WABT_FEATURE
}